

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_reduce(HSQUIRRELVM v)

{
  SQBool raiseerror;
  SQObjectPtr *nidx;
  SQObjectPtr *obj;
  HSQUIRRELVM in_RDI;
  SQInteger n;
  SQObjectPtr other;
  SQInteger iterStart;
  SQObjectPtr res;
  SQInteger size;
  SQArray *a;
  SQObject *o;
  SQObjectPtr *in_stack_ffffffffffffff48;
  HSQUIRRELVM in_stack_ffffffffffffff50;
  SQObjectPtr *in_stack_ffffffffffffff58;
  SQObjectPtr *in_stack_ffffffffffffff60;
  HSQUIRRELVM this;
  SQObjectPtr *in_stack_ffffffffffffff68;
  HSQUIRRELVM val;
  SQInteger in_stack_ffffffffffffff70;
  SQArray *in_stack_ffffffffffffff78;
  SQBool in_stack_ffffffffffffff88;
  SQObjectValue in_stack_ffffffffffffff90;
  HSQUIRRELVM v_00;
  SQObjectPtr local_60;
  int local_50;
  HSQUIRRELVM local_40;
  SQObjectPtr local_38;
  SQInteger local_28;
  SQObjectValue local_20;
  SQObject *local_18;
  HSQUIRRELVM local_10;
  SQInteger local_8;
  
  local_10 = in_RDI;
  local_18 = &stack_get(in_stack_ffffffffffffff50,(SQInteger)in_stack_ffffffffffffff48)->
              super_SQObject;
  local_20 = local_18->_unVal;
  local_28 = SQArray::Size((SQArray *)0x146c0a);
  SQObjectPtr::SQObjectPtr(&local_38);
  raiseerror = sq_gettop(local_10);
  if ((long)raiseerror < 3) {
    if (local_28 == 0) {
      local_8 = 0;
      local_50 = 1;
      goto LAB_00146eeb;
    }
    SQArray::Get(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_40 = (HSQUIRRELVM)0x1;
  }
  else {
    in_stack_ffffffffffffff78 =
         (SQArray *)stack_get(in_stack_ffffffffffffff50,(SQInteger)in_stack_ffffffffffffff48);
    SQObjectPtr::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_40 = (HSQUIRRELVM)0x0;
  }
  if ((long)local_40 < local_28) {
    SQObjectPtr::SQObjectPtr(&local_60);
    val = local_10;
    nidx = stack_get(in_stack_ffffffffffffff50,(SQInteger)in_stack_ffffffffffffff48);
    SQVM::Push(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    for (v_00 = local_40; (long)v_00 < local_28;
        v_00 = (HSQUIRRELVM)
               ((long)&(v_00->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted + 1)) {
      SQArray::Get(in_stack_ffffffffffffff78,(SQInteger)nidx,(SQObjectPtr *)val);
      this = local_10;
      SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff88,local_18);
      SQVM::Push(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff50);
      SQVM::Push(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      SQVM::Push(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      obj = (SQObjectPtr *)
            sq_call(v_00,in_stack_ffffffffffffff90.nInteger,in_stack_ffffffffffffff88,raiseerror);
      if ((long)obj < 0) {
        local_8 = -1;
        local_50 = 1;
        goto LAB_00146e9e;
      }
      in_stack_ffffffffffffff50 =
           (HSQUIRRELVM)SQVM::GetUp(in_stack_ffffffffffffff50,(SQInteger)in_stack_ffffffffffffff48);
      SQObjectPtr::operator=((SQObjectPtr *)this,obj);
      SQVM::Pop((SQVM *)0x146e70);
    }
    SQVM::Pop((SQVM *)0x146e94);
    local_50 = 0;
LAB_00146e9e:
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff50);
    if (local_50 != 0) goto LAB_00146eeb;
  }
  SQVM::Push(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_8 = 1;
  local_50 = 1;
LAB_00146eeb:
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff50);
  return local_8;
}

Assistant:

static SQInteger array_reduce(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQArray *a = _array(o);
    SQInteger size = a->Size();
    SQObjectPtr res;
    SQInteger iterStart;
    if (sq_gettop(v)>2) {
        res = stack_get(v,3);
        iterStart = 0;
    } else if (size==0) {
        return 0;
    } else {
        a->Get(0,res);
        iterStart = 1;
    }
    if (size > iterStart) {
        SQObjectPtr other;
        v->Push(stack_get(v,2));
        for (SQInteger n = iterStart; n < size; n++) {
            a->Get(n,other);
            v->Push(o);
            v->Push(res);
            v->Push(other);
            if(SQ_FAILED(sq_call(v,3,SQTrue,SQFalse))) {
                return SQ_ERROR;
            }
            res = v->GetUp(-1);
            v->Pop();
        }
        v->Pop();
    }
    v->Push(res);
    return 1;
}